

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O1

int __thiscall
CVmObjVector::getp_map_all(CVmObjVector *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  CVmObjPageEntry *pCVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  vm_datatype_t *pvVar3;
  undefined4 uVar4;
  vm_val_t *pvVar5;
  vm_val_t *pvVar6;
  int iVar7;
  vm_obj_id_t vVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  long *plVar12;
  vm_rcdesc rc;
  vm_rcdesc vStack_78;
  
  if (getp_map_all(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_map_all();
  }
  vm_rcdesc::init(&vStack_78,(EVP_PKEY_CTX *)"Vector.mapAll");
  iVar7 = CVmObject::get_prop_check_argc(retval,argc,&getp_map_all::desc);
  pvVar6 = sp_;
  if (iVar7 == 0) {
    pvVar3 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar3 = VM_OBJ;
    (pvVar6->val).obj = self;
    vVar8 = create(0,(ulong)*(ushort *)(this->super_CVmObjCollection).super_CVmObject.ext_);
    retval->typ = VM_OBJ;
    (retval->val).obj = vVar8;
    pvVar5 = sp_;
    pCVar1 = G_obj_table_X.pages_[vVar8 >> 0xc];
    uVar4 = *(undefined4 *)&retval->field_0x4;
    aVar2 = retval->val;
    sp_ = sp_ + 1;
    pvVar5->typ = retval->typ;
    *(undefined4 *)&pvVar5->field_0x4 = uVar4;
    pvVar5->val = aVar2;
    pcVar9 = (this->super_CVmObjCollection).super_CVmObject.ext_;
    if (*(short *)(pcVar9 + 2) != 0) {
      plVar12 = (long *)((long)&pCVar1[vVar8 & 0xfff].ptr_ + 8);
      lVar10 = 4;
      uVar11 = 0;
      do {
        pvVar5 = sp_;
        pvVar3 = &sp_->typ;
        sp_ = sp_ + 1;
        *pvVar3 = (int)pcVar9[lVar10];
        vmb_get_dh_val(pcVar9 + lVar10,pvVar5);
        CVmRun::call_func_ptr(&G_interpreter_X,pvVar6 + -1,1,&vStack_78,0);
        vmb_put_dh((char *)(*plVar12 + lVar10),&r0_);
        uVar11 = uVar11 + 1;
        *(short *)(*plVar12 + 2) = (short)uVar11;
        pcVar9 = (this->super_CVmObjCollection).super_CVmObject.ext_;
        lVar10 = lVar10 + 5;
      } while (uVar11 < *(ushort *)(pcVar9 + 2));
    }
    sp_ = sp_ + -3;
  }
  return 1;
}

Assistant:

int CVmObjVector::getp_map_all(VMG_ vm_obj_id_t self, vm_val_t *retval,
                               uint *argc)
{
    const vm_val_t *func_val;
    size_t idx;
    CVmObjVector *new_vec;
    static CVmNativeCodeDesc desc(1);
    vm_rcdesc rc(vmg_ "Vector.mapAll", self, 10, G_stk->get(0), argc);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get the function pointer argument, but leave it on the stack */
    func_val = G_stk->get(0);

    /* push a self-reference while working to protect from gc */
    G_interpreter->push_obj(vmg_ self);

    /* 
     *   allocate a new vector for the return value - the new vector will
     *   have the same size as the original, since we're mapping each
     *   element of the old vector to the corresponding element of the new
     *   vector 
     */
    retval->set_obj(create(vmg_ FALSE, get_allocated_count()));

    /* get the return value as an vector */
    new_vec = (CVmObjVector *)vm_objp(vmg_ retval->val.obj);

    /* 
     *   push a reference to the new list to protect it from the garbage
     *   collector, which could be invoked in the course of executing the
     *   user callback 
     */
    G_stk->push(retval);

    /*
     *   Go through each element of our vector, and invoke the callback on
     *   each element, storing the result in the corresponding element of
     *   the new vector.  Note that we re-check the element count on each
     *   iteration, in case the callback changes it on us.  
     */
    for (idx = 0 ; idx < get_element_count() ; ++idx)
    {
        /* push the element as the callback's argument */
        push_element(vmg_ idx);

        /* invoke the callback */
        G_interpreter->call_func_ptr(vmg_ func_val, 1, &rc, 0);

        /* 
         *   replace this element with the result (there's no need to save
         *   undo, since the whole vector is new) 
         */
        new_vec->set_element(idx, G_interpreter->get_r0());
        new_vec->set_element_count(idx + 1);
    }

    /* discard our gc protection (self, new vector) and our arguments */
    G_stk->discard(3);

    /* handled */
    return TRUE;
}